

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O2

void __thiscall
scheduler_tests::singlethreadedscheduler_ordered::test_method(singlethreadedscheduler_ordered *this)

{
  long lVar1;
  function<void_()> func;
  function<void_()> func_00;
  pointer ptVar2;
  pointer __result;
  thread *ptVar3;
  anon_class_8_1_0c04475b_for__M_head_impl *extraout_RDX;
  anon_class_8_1_0c04475b_for__M_head_impl *__args;
  anon_class_8_1_0c04475b_for__M_head_impl *extraout_RDX_00;
  anon_class_8_1_0c04475b_for__M_head_impl *__args_00;
  anon_class_8_1_0c04475b_for__M_head_impl *extraout_RDX_01;
  thread *thread;
  pointer ptVar4;
  int iVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  int *piVar7;
  uint uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  size_type in_stack_fffffffffffffd88;
  pointer in_stack_fffffffffffffd90;
  _Manager_type in_stack_fffffffffffffd98;
  _Invoker_type in_stack_fffffffffffffda0;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined4 local_234;
  char *local_230;
  char *local_228;
  thread local_220;
  undefined1 local_218;
  undefined1 *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  _Any_data local_1e0;
  code *local_1d0;
  code *local_1c8;
  _Any_data local_1c0;
  code *local_1b0;
  code *local_1a8;
  int counter2;
  int counter1;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  SerialTaskRunner queue2;
  SerialTaskRunner queue1;
  CScheduler scheduler;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScheduler::CScheduler(&scheduler);
  queue1.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&queue1.m_callbacks_pending;
  queue1.super_TaskRunnerInterface._vptr_TaskRunnerInterface =
       (_func_int **)&PTR__SerialTaskRunner_01157d88;
  queue1.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  queue1.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__align = 0;
  queue1.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  queue1.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  queue1.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  queue1.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  ._M_size = 0;
  queue2.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&queue2.m_callbacks_pending;
  queue2.super_TaskRunnerInterface._vptr_TaskRunnerInterface =
       (_func_int **)&PTR__SerialTaskRunner_01157d88;
  queue2.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__align = 0;
  queue2.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  queue2.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  queue2.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  queue2.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  queue2.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  ._M_size = 0;
  queue1.m_are_callbacks_running = false;
  queue2.m_are_callbacks_running = false;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  queue2.m_scheduler = &scheduler;
  queue2.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_prev =
       queue2.m_callbacks_pending.
       super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  queue1.m_scheduler = &scheduler;
  queue1.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_prev =
       queue1.m_callbacks_pending.
       super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,5);
  iVar5 = 5;
  __args = extraout_RDX;
  while( true ) {
    ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar9 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar9) break;
    local_220._M_id._M_thread = (id)(id)&scheduler;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      in_stack_fffffffffffffd88 =
           std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                     (&threads,1,"vector::_M_realloc_insert");
      ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      in_stack_fffffffffffffd90 =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,
                            in_stack_fffffffffffffd88);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,scheduler_tests::singlethreadedscheduler_ordered::test_method()::__2>
                ((allocator_type *)(((long)ptVar2 - (long)ptVar4) + (long)__result),&local_220,
                 __args_00);
      ptVar3 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar4,ptVar2,__result,(allocator<std::thread> *)&threads);
      ptVar3 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar2,in_stack_fffffffffffffd90,ptVar3 + 1,
                          (allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar4,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar4 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __result + in_stack_fffffffffffffd88;
      __args = extraout_RDX_01;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = __result;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar3;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,scheduler_tests::singlethreadedscheduler_ordered::test_method()::__2>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_220,__args);
      __args = extraout_RDX_00;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  counter1 = 0;
  counter2 = 0;
  for (uVar8 = 0; uVar8 != 100; uVar8 = uVar8 + 1) {
    local_1c0._4_4_ = 0;
    local_1c0._0_4_ = uVar8;
    local_1c0._8_8_ = &counter1;
    local_1a8 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp:153:23)>
                ::_M_invoke;
    local_1b0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp:153:23)>
                ::_M_manager;
    func.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd90;
    func.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd88;
    func.super__Function_base._M_manager = in_stack_fffffffffffffd98;
    func._M_invoker = in_stack_fffffffffffffda0;
    SerialTaskRunner::insert(&queue1,func);
    std::_Function_base::~_Function_base((_Function_base *)&local_1c0);
    local_1e0._4_4_ = 0;
    local_1e0._0_4_ = uVar8;
    local_1e0._8_8_ = &counter2;
    local_1c8 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp:158:23)>
                ::_M_invoke;
    local_1d0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp:158:23)>
                ::_M_manager;
    func_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd90;
    func_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd88;
    func_00.super__Function_base._M_manager = in_stack_fffffffffffffd98;
    func_00._M_invoker = in_stack_fffffffffffffda0;
    SerialTaskRunner::insert(&queue2,func_00);
    std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
  }
  CScheduler::StopWhenDrained(&scheduler);
  ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; ptVar4 != ptVar2; ptVar4 = ptVar4 + 1) {
    if ((ptVar4->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xaa;
  file.m_begin = (iterator)&local_1f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_200,msg);
  local_218 = 0;
  local_220._M_id._M_thread = (id)&PTR__lazy_ostream_011480b0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_228 = "";
  local_234 = 100;
  pvVar6 = (iterator)0x2;
  piVar7 = &counter1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_220,&local_230,0xaa,1,2,piVar7,"counter1",&local_234,"100");
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xab;
  file_00.m_begin = (iterator)&local_248;
  msg_00.m_end = (iterator)piVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_258,
             msg_00);
  local_218 = 0;
  local_220._M_id._M_thread = (id)&PTR__lazy_ostream_011480b0;
  local_210 = boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_234 = 100;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_220,&stack0xfffffffffffffd98,0xab,1,2,&counter2,"counter2",&local_234,"100");
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  SerialTaskRunner::~SerialTaskRunner(&queue2);
  SerialTaskRunner::~SerialTaskRunner(&queue1);
  CScheduler::~CScheduler(&scheduler);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(singlethreadedscheduler_ordered)
{
    CScheduler scheduler;

    // each queue should be well ordered with respect to itself but not other queues
    SerialTaskRunner queue1(scheduler);
    SerialTaskRunner queue2(scheduler);

    // create more threads than queues
    // if the queues only permit execution of one task at once then
    // the extra threads should effectively be doing nothing
    // if they don't we'll get out of order behaviour
    std::vector<std::thread> threads;
    threads.reserve(5);
    for (int i = 0; i < 5; ++i) {
        threads.emplace_back([&] { scheduler.serviceQueue(); });
    }

    // these are not atomic, if SerialTaskRunner prevents
    // parallel execution at the queue level no synchronization should be required here
    int counter1 = 0;
    int counter2 = 0;

    // just simply count up on each queue - if execution is properly ordered then
    // the callbacks should run in exactly the order in which they were enqueued
    for (int i = 0; i < 100; ++i) {
        queue1.insert([i, &counter1]() {
            bool expectation = i == counter1++;
            assert(expectation);
        });

        queue2.insert([i, &counter2]() {
            bool expectation = i == counter2++;
            assert(expectation);
        });
    }

    // finish up
    scheduler.StopWhenDrained();
    for (auto& thread: threads) {
        if (thread.joinable()) thread.join();
    }

    BOOST_CHECK_EQUAL(counter1, 100);
    BOOST_CHECK_EQUAL(counter2, 100);
}